

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O1

void __thiscall serial::Serial::SerialImpl::reconfigurePort(SerialImpl *this)

{
  stopbits_t sVar1;
  unsigned_long uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  invalid_argument *this_00;
  IOException *pIVar6;
  int *piVar7;
  byte bVar8;
  ulong uVar9;
  uint uVar10;
  speed_t unaff_EBP;
  termios local_124;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  undefined1 local_68 [16];
  uint local_58;
  int local_50;
  int local_4c;
  
  if (this->fd_ == -1) {
    pIVar6 = (IOException *)__cxa_allocate_exception(0x78);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]serial/src/impl/unix.cc"
               ,"");
    IOException::IOException
              (pIVar6,&local_88,0xa4,"Invalid file descriptor, is the serial port open?");
    __cxa_throw(pIVar6,&IOException::typeinfo,IOException::~IOException);
  }
  iVar4 = tcgetattr(this->fd_,&local_124);
  if (iVar4 == -1) {
    pIVar6 = (IOException *)__cxa_allocate_exception(0x78);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]serial/src/impl/unix.cc"
               ,"");
    IOException::IOException(pIVar6,&local_a8,0xaa,"::tcgetattr");
    __cxa_throw(pIVar6,&IOException::typeinfo,IOException::~IOException);
  }
  local_124.c_cflag = local_124.c_cflag | 0x880;
  local_124.c_lflag = local_124.c_lflag & 0xffff7f84;
  local_124.c_oflag._0_1_ = (byte)local_124.c_oflag & 0xfe;
  local_124.c_iflag = local_124.c_iflag & 0xfffffc36;
  uVar2 = this->baudrate_;
  bVar3 = true;
  if ((long)uVar2 < 0x9600) {
    if ((long)uVar2 < 300) {
      if ((long)uVar2 < 0x6e) {
        if (uVar2 == 0) {
          unaff_EBP = 0;
        }
        else if (uVar2 == 0x32) {
          unaff_EBP = 1;
        }
        else {
          if (uVar2 != 0x4b) goto LAB_00108b8d;
          unaff_EBP = 2;
        }
      }
      else if ((long)uVar2 < 0x96) {
        if (uVar2 == 0x6e) {
          unaff_EBP = 3;
        }
        else {
          if (uVar2 != 0x86) goto LAB_00108b8d;
          unaff_EBP = 4;
        }
      }
      else if (uVar2 == 0x96) {
        unaff_EBP = 5;
      }
      else {
        if (uVar2 != 200) goto LAB_00108b8d;
        unaff_EBP = 6;
      }
    }
    else if ((long)uVar2 < 0x960) {
      if ((long)uVar2 < 0x4b0) {
        if (uVar2 == 300) {
          unaff_EBP = 7;
        }
        else {
          if (uVar2 != 600) goto LAB_00108b8d;
          unaff_EBP = 8;
        }
      }
      else if (uVar2 == 0x4b0) {
        unaff_EBP = 9;
      }
      else {
        if (uVar2 != 0x708) goto LAB_00108b8d;
        unaff_EBP = 10;
      }
    }
    else if ((long)uVar2 < 0x2580) {
      if (uVar2 == 0x960) {
        unaff_EBP = 0xb;
      }
      else {
        if (uVar2 != 0x12c0) goto LAB_00108b8d;
        unaff_EBP = 0xc;
      }
    }
    else if (uVar2 == 0x2580) {
      unaff_EBP = 0xd;
    }
    else {
      if (uVar2 != 0x4b00) goto LAB_00108b8d;
      unaff_EBP = 0xe;
    }
  }
  else if ((long)uVar2 < 1000000) {
    if ((long)uVar2 < 0x70800) {
      if ((long)uVar2 < 0x1c200) {
        if (uVar2 == 0x9600) {
          unaff_EBP = 0xf;
        }
        else if (uVar2 == 0xe100) {
          unaff_EBP = 0x1001;
        }
        else {
LAB_00108b8d:
          iVar4 = ioctl(this->fd_,0x541e,local_68);
          if (iVar4 == -1) {
            pIVar6 = (IOException *)__cxa_allocate_exception(0x78);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]serial/src/impl/unix.cc"
                       ,"");
            piVar7 = __errno_location();
            IOException::IOException(pIVar6,&local_c8,0x142,*piVar7);
            __cxa_throw(pIVar6,&IOException::typeinfo,IOException::~IOException);
          }
          local_50 = local_4c / (int)this->baudrate_;
          local_58 = local_58 & 0xffffefcf | 0x30;
          iVar4 = ioctl(this->fd_,0x541f,local_68);
          if (iVar4 == -1) {
            pIVar6 = (IOException *)__cxa_allocate_exception(0x78);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]serial/src/impl/unix.cc"
                       ,"");
            piVar7 = __errno_location();
            IOException::IOException(pIVar6,&local_e8,0x14c,*piVar7);
            __cxa_throw(pIVar6,&IOException::typeinfo,IOException::~IOException);
          }
          bVar3 = false;
        }
      }
      else if (uVar2 == 0x1c200) {
        unaff_EBP = 0x1002;
      }
      else {
        if (uVar2 != 0x38400) goto LAB_00108b8d;
        unaff_EBP = 0x1003;
      }
    }
    else if ((long)uVar2 < 0x8ca00) {
      if (uVar2 == 0x70800) {
        unaff_EBP = 0x1004;
      }
      else {
        if (uVar2 != 500000) goto LAB_00108b8d;
        unaff_EBP = 0x1005;
      }
    }
    else if (uVar2 == 0x8ca00) {
      unaff_EBP = 0x1006;
    }
    else {
      if (uVar2 != 0xe1000) goto LAB_00108b8d;
      unaff_EBP = 0x1007;
    }
  }
  else if ((long)uVar2 < 2500000) {
    if ((long)uVar2 < 1500000) {
      if (uVar2 == 1000000) {
        unaff_EBP = 0x1008;
      }
      else {
        if (uVar2 != 0x119400) goto LAB_00108b8d;
        unaff_EBP = 0x1009;
      }
    }
    else if (uVar2 == 1500000) {
      unaff_EBP = 0x100a;
    }
    else {
      if (uVar2 != 2000000) goto LAB_00108b8d;
      unaff_EBP = 0x100b;
    }
  }
  else if ((long)uVar2 < 3500000) {
    if (uVar2 == 2500000) {
      unaff_EBP = 0x100c;
    }
    else {
      if (uVar2 != 3000000) goto LAB_00108b8d;
      unaff_EBP = 0x100d;
    }
  }
  else if (uVar2 == 3500000) {
    unaff_EBP = 0x100e;
  }
  else {
    if (uVar2 != 4000000) goto LAB_00108b8d;
    unaff_EBP = 0x100f;
  }
  if (bVar3) {
    cfsetispeed(&local_124,unaff_EBP);
    cfsetospeed(&local_124,unaff_EBP);
  }
  uVar5 = local_124.c_cflag & 0xffffffcf;
  switch(this->bytesize_) {
  case fivebits:
    break;
  case sixbits:
    uVar5 = uVar5 | 0x10;
    break;
  case sevenbits:
    uVar5 = uVar5 | 0x20;
    break;
  case eightbits:
    uVar5 = local_124.c_cflag | 0x30;
    break;
  default:
    local_124.c_cflag = uVar5;
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"invalid char len");
    goto LAB_00108f5a;
  }
  sVar1 = this->stopbits_;
  if ((sVar1 == stopbits_one_point_five) || (sVar1 == stopbits_two)) {
    local_124.c_cflag = uVar5 | 0x40;
  }
  else {
    if (sVar1 != stopbits_one) {
      local_124.c_cflag = uVar5;
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"invalid stop bit");
      goto LAB_00108f5a;
    }
    local_124.c_cflag = uVar5 & 0xffffffbf;
  }
  switch(this->parity_) {
  case parity_none:
    uVar5 = local_124.c_cflag & 0xfffffcff;
    break;
  case parity_odd:
    uVar5 = 0x300;
    goto LAB_00108d40;
  case parity_even:
    uVar5 = local_124.c_cflag & 0xfffffcff | 0x100;
    break;
  case parity_mark:
    uVar5 = 0x40000300;
LAB_00108d40:
    uVar5 = uVar5 | local_124.c_cflag;
    break;
  case parity_space:
    uVar5 = local_124.c_cflag & 0xbffffcff | 0x40000100;
    break;
  default:
    local_124.c_iflag = local_124.c_iflag & 0xffffffcf;
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"invalid parity");
LAB_00108f5a:
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (this->flowcontrol_ < (flowcontrol_hardware|flowcontrol_software)) {
    bVar8 = (byte)(this->flowcontrol_ << 3);
    this->xonxoff_ = SUB41(0x100 >> (bVar8 & 0x1f),0);
    this->rtscts_ = SUB41(0x10000 >> (bVar8 & 0x1f),0);
  }
  uVar10 = local_124.c_iflag & 0xffffe3cf;
  local_124.c_iflag = local_124.c_iflag & 0xffffffcf | 0x1400;
  if (this->xonxoff_ == false) {
    local_124.c_iflag = uVar10;
  }
  local_124.c_cflag = (uint)this->rtscts_ << 0x1f | uVar5 & 0x7fffffff;
  local_124.c_cc[5] = '\0';
  local_124.c_cc[6] = '\0';
  tcsetattr(this->fd_,0,&local_124);
  uVar9 = (ulong)(1000000000.0 /
                 (((double)CONCAT44(0x45300000,(int)(this->baudrate_ >> 0x20)) -
                  1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)this->baudrate_) - 4503599627370496.0)));
  uVar5 = (this->bytesize_ + this->parity_ + this->stopbits_ + 1) * (int)uVar9;
  if (this->stopbits_ == stopbits_one_point_five) {
    uVar5 = (uint)(long)((double)(uVar9 & 0xffffffff) * -1.5 + (double)uVar5);
  }
  this->byte_time_ns_ = uVar5;
  return;
}

Assistant:

void
Serial::SerialImpl::reconfigurePort ()
{
  if (fd_ == -1) {
    // Can only operate on a valid file descriptor
    THROW (IOException, "Invalid file descriptor, is the serial port open?");
  }

  struct termios options; // The options for the file descriptor

  if (tcgetattr(fd_, &options) == -1) {
    THROW (IOException, "::tcgetattr");
  }

  // set up raw mode / no echo / binary
  options.c_cflag |= (tcflag_t)  (CLOCAL | CREAD);
  options.c_lflag &= (tcflag_t) ~(ICANON | ECHO | ECHOE | ECHOK | ECHONL |
                                       ISIG | IEXTEN); //|ECHOPRT

  options.c_oflag &= (tcflag_t) ~(OPOST);
  options.c_iflag &= (tcflag_t) ~(INLCR | IGNCR | ICRNL | IGNBRK);
#ifdef IUCLC
  options.c_iflag &= (tcflag_t) ~IUCLC;
#endif
#ifdef PARMRK
  options.c_iflag &= (tcflag_t) ~PARMRK;
#endif

  // setup baud rate
  bool custom_baud = false;
  speed_t baud;
  switch (baudrate_) {
#ifdef B0
  case 0: baud = B0; break;
#endif
#ifdef B50
  case 50: baud = B50; break;
#endif
#ifdef B75
  case 75: baud = B75; break;
#endif
#ifdef B110
  case 110: baud = B110; break;
#endif
#ifdef B134
  case 134: baud = B134; break;
#endif
#ifdef B150
  case 150: baud = B150; break;
#endif
#ifdef B200
  case 200: baud = B200; break;
#endif
#ifdef B300
  case 300: baud = B300; break;
#endif
#ifdef B600
  case 600: baud = B600; break;
#endif
#ifdef B1200
  case 1200: baud = B1200; break;
#endif
#ifdef B1800
  case 1800: baud = B1800; break;
#endif
#ifdef B2400
  case 2400: baud = B2400; break;
#endif
#ifdef B4800
  case 4800: baud = B4800; break;
#endif
#ifdef B7200
  case 7200: baud = B7200; break;
#endif
#ifdef B9600
  case 9600: baud = B9600; break;
#endif
#ifdef B14400
  case 14400: baud = B14400; break;
#endif
#ifdef B19200
  case 19200: baud = B19200; break;
#endif
#ifdef B28800
  case 28800: baud = B28800; break;
#endif
#ifdef B57600
  case 57600: baud = B57600; break;
#endif
#ifdef B76800
  case 76800: baud = B76800; break;
#endif
#ifdef B38400
  case 38400: baud = B38400; break;
#endif
#ifdef B115200
  case 115200: baud = B115200; break;
#endif
#ifdef B128000
  case 128000: baud = B128000; break;
#endif
#ifdef B153600
  case 153600: baud = B153600; break;
#endif
#ifdef B230400
  case 230400: baud = B230400; break;
#endif
#ifdef B256000
  case 256000: baud = B256000; break;
#endif
#ifdef B460800
  case 460800: baud = B460800; break;
#endif
#ifdef B500000
  case 500000: baud = B500000; break;
#endif
#ifdef B576000
  case 576000: baud = B576000; break;
#endif
#ifdef B921600
  case 921600: baud = B921600; break;
#endif
#ifdef B1000000
  case 1000000: baud = B1000000; break;
#endif
#ifdef B1152000
  case 1152000: baud = B1152000; break;
#endif
#ifdef B1500000
  case 1500000: baud = B1500000; break;
#endif
#ifdef B2000000
  case 2000000: baud = B2000000; break;
#endif
#ifdef B2500000
  case 2500000: baud = B2500000; break;
#endif
#ifdef B3000000
  case 3000000: baud = B3000000; break;
#endif
#ifdef B3500000
  case 3500000: baud = B3500000; break;
#endif
#ifdef B4000000
  case 4000000: baud = B4000000; break;
#endif
  default:
    custom_baud = true;
    // OS X support
#if defined(MAC_OS_X_VERSION_10_4) && (MAC_OS_X_VERSION_MIN_REQUIRED >= MAC_OS_X_VERSION_10_4)
    // Starting with Tiger, the IOSSIOSPEED ioctl can be used to set arbitrary baud rates
    // other than those specified by POSIX. The driver for the underlying serial hardware
    // ultimately determines which baud rates can be used. This ioctl sets both the input
    // and output speed.
    speed_t new_baud = static_cast<speed_t> (baudrate_);
    if (-1 == ioctl (fd_, IOSSIOSPEED, &new_baud, 1)) {
      THROW (IOException, errno);
    }
    // Linux Support
#elif defined(__linux__) && defined (TIOCSSERIAL)
    struct serial_struct ser;

    if (-1 == ioctl (fd_, TIOCGSERIAL, &ser)) {
      THROW (IOException, errno);
    }

    // set custom divisor
    ser.custom_divisor = ser.baud_base / static_cast<int> (baudrate_);
    // update flags
    ser.flags &= ~ASYNC_SPD_MASK;
    ser.flags |= ASYNC_SPD_CUST;

    if (-1 == ioctl (fd_, TIOCSSERIAL, &ser)) {
      THROW (IOException, errno);
    }
#else
    throw invalid_argument ("OS does not currently support custom bauds");
#endif
  }
  if (custom_baud == false) {
#ifdef _BSD_SOURCE
    ::cfsetspeed(&options, baud);
#else
    ::cfsetispeed(&options, baud);
    ::cfsetospeed(&options, baud);
#endif
  }

  // setup char len
  options.c_cflag &= (tcflag_t) ~CSIZE;
  if (bytesize_ == eightbits)
    options.c_cflag |= CS8;
  else if (bytesize_ == sevenbits)
    options.c_cflag |= CS7;
  else if (bytesize_ == sixbits)
    options.c_cflag |= CS6;
  else if (bytesize_ == fivebits)
    options.c_cflag |= CS5;
  else
    throw invalid_argument ("invalid char len");
  // setup stopbits
  if (stopbits_ == stopbits_one)
    options.c_cflag &= (tcflag_t) ~(CSTOPB);
  else if (stopbits_ == stopbits_one_point_five)
    // ONE POINT FIVE same as TWO.. there is no POSIX support for 1.5
    options.c_cflag |=  (CSTOPB);
  else if (stopbits_ == stopbits_two)
    options.c_cflag |=  (CSTOPB);
  else
    throw invalid_argument ("invalid stop bit");
  // setup parity
  options.c_iflag &= (tcflag_t) ~(INPCK | ISTRIP);
  if (parity_ == parity_none) {
    options.c_cflag &= (tcflag_t) ~(PARENB | PARODD);
  } else if (parity_ == parity_even) {
    options.c_cflag &= (tcflag_t) ~(PARODD);
    options.c_cflag |=  (PARENB);
  } else if (parity_ == parity_odd) {
    options.c_cflag |=  (PARENB | PARODD);
  }
#ifdef CMSPAR
  else if (parity_ == parity_mark) {
    options.c_cflag |=  (PARENB | CMSPAR | PARODD);
  }
  else if (parity_ == parity_space) {
    options.c_cflag |=  (PARENB | CMSPAR);
    options.c_cflag &= (tcflag_t) ~(PARODD);
  }
#else
  // CMSPAR is not defined on OSX. So do not support mark or space parity.
  else if (parity_ == parity_mark || parity_ == parity_space) {
    throw invalid_argument ("OS does not support mark or space parity");
  }
#endif  // ifdef CMSPAR
  else {
    throw invalid_argument ("invalid parity");
  }